

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O2

void decode_nvrm_mthd_subdevice_unk0101
               (nvrm_mthd_subdevice_unk0101 *m,mmt_memory_dump *args,int argc)

{
  uint uVar1;
  int iVar2;
  mmt_buf *buf;
  
  uVar1 = m->cnt;
  if (uVar1 == 0) {
    iVar2 = _nvrm_field_enabled("cnt");
    if (iVar2 != 0) {
      uVar1 = m->cnt;
      goto LAB_0025bc53;
    }
  }
  else {
LAB_0025bc53:
    fprintf(_stdout,"%scnt: 0x%08x",nvrm_pfx,(ulong)uVar1);
  }
  nvrm_pfx = nvrm_sep;
  if (m->_pad != 0) {
    fprintf(_stdout,"%s%s_pad: 0x%08x%s",nvrm_sep,colors->err,(ulong)m->_pad,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  if (m->ptr == 0) {
    iVar2 = _nvrm_field_enabled("ptr");
    if (iVar2 != 0) {
      if (m->ptr == 0) {
        buf = (mmt_buf *)0x0;
        fprintf(_stdout,"%sptr: %s",nvrm_pfx,"NULL");
        goto LAB_0025bd55;
      }
      goto LAB_0025bcce;
    }
  }
  else {
LAB_0025bcce:
    fprintf(_stdout,"%sptr: 0x%016lx",nvrm_pfx);
    if (0 < argc) {
      buf = find_ptr(m->ptr,args,argc);
      if (buf != (mmt_buf *)0x0) goto LAB_0025bd55;
    }
    fputs(" [no data]",_stdout);
  }
  buf = (mmt_buf *)0x0;
LAB_0025bd55:
  nvrm_pfx = nvrm_sep;
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  if (buf != (mmt_buf *)0x0) {
    dump_mmt_buf_as_word_pairs(buf,(_func_char_ptr_uint32_t *)0x0);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_subdevice_unk0101(struct nvrm_mthd_subdevice_unk0101 *m,
		struct mmt_memory_dump *args, int argc)
{
	nvrm_print_x32(m, cnt);
	nvrm_print_pad_x32(m, _pad);
	struct mmt_buf *data = nvrm_print_ptr(m, ptr, args, argc);
	nvrm_print_ln();

	if (data)
		dump_mmt_buf_as_word_pairs(data, NULL);
}